

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O3

string * __thiscall
OpenMPDepobjUpdateClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPDepobjUpdateClause *this)

{
  string clause_string;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"update ","");
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"(","");
  if (this->type < OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_unknown) {
    std::__cxx11::string::append((char *)&local_40);
  }
  std::__cxx11::string::append((char *)&local_40);
  if (3 < local_38) {
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDepobjUpdateClause::toString() {

    std::string result = "update ";
    std::string clause_string = "(";
    OpenMPDepobjUpdateClauseDependeceType type = this->getType();
    switch (type) {
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_source:
            clause_string += "source";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_in:
            clause_string += "in";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_out:
            clause_string += "out";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_inout:
            clause_string += "inout";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_mutexinoutset:
            clause_string += "mutexinoutset";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_depobj:
            clause_string += "depobj";
            break;
        case OMPC_DEPOBJ_UPDATE_DEPENDENCE_TYPE_sink:
            clause_string += "sink";
            break;
        default:
            ;
    }
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}